

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::MultisampleTextureTexStorage2DInvalidAndBorderCaseTextureSizesTest::iterate
          (MultisampleTextureTexStorage2DInvalidAndBorderCaseTextureSizesTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *pTVar4;
  int local_1c;
  GLenum error_code;
  GLint gl_max_texture_size_value;
  Functions *gl;
  MultisampleTextureTexStorage2DInvalidAndBorderCaseTextureSizesTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _error_code = CONCAT44(extraout_var,iVar1);
  initInternals(this);
  local_1c = 0;
  (**(code **)(_error_code + 0x868))(0xd33,&local_1c);
  dVar2 = (**(code **)(_error_code + 0x800))();
  glu::checkError(dVar2,"Could not retrieve GL_MAX_TEXTURE_SIZE pname value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x100);
  (**(code **)(_error_code + 0xb8))(0x9100,this->to_id);
  (**(code **)(_error_code + 0x1390))(0x9100,2,0x8058,local_1c,1);
  dVar2 = (**(code **)(_error_code + 0x800))();
  glu::checkError(dVar2,
                  "Valid glTexStorage2DMultisample() call ((max texture size, 1) resolution) failed"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x109);
  (**(code **)(_error_code + 0x480))(1,&this->to_id);
  dVar2 = (**(code **)(_error_code + 0x800))();
  glu::checkError(dVar2,"glDeleteTextures() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x10e);
  (**(code **)(_error_code + 0x6f8))(1,&this->to_id);
  (**(code **)(_error_code + 0xb8))(0x9100,this->to_id);
  dVar2 = (**(code **)(_error_code + 0x800))();
  glu::checkError(dVar2,"Could not re-create 2D multisample texture object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x114);
  (**(code **)(_error_code + 0x1390))(0x9100,2,0x8058,1,local_1c);
  dVar2 = (**(code **)(_error_code + 0x800))();
  glu::checkError(dVar2,
                  "Valid glTexStorage2DMultisample() call ((1, max texture size) resolution) failed"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x11b);
  (**(code **)(_error_code + 0x480))(1,&this->to_id);
  dVar2 = (**(code **)(_error_code + 0x800))();
  glu::checkError(dVar2,"glDeleteTextures() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x120);
  (**(code **)(_error_code + 0x6f8))(1,&this->to_id);
  (**(code **)(_error_code + 0xb8))(0x9100,this->to_id);
  dVar2 = (**(code **)(_error_code + 0x800))();
  glu::checkError(dVar2,"Could not re-create 2D multisample texture object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x126);
  (**(code **)(_error_code + 0x1390))(0x9100,2,0x8058,local_1c + 1,1);
  iVar1 = (**(code **)(_error_code + 0x800))();
  if (iVar1 != 0x501) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,
               "Invalid glTexStorage2DMultisample() call ((max texture size+1, 1) resolution) did not generate GL_INVALID_VALUE error"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
               ,0x134);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(_error_code + 0x1390))(0x9100,2,0x8058,1,local_1c + 1);
  iVar1 = (**(code **)(_error_code + 0x800))();
  if (iVar1 != 0x501) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,
               "Invalid glTexStorage2DMultisample() call ((1, max texture size+1) resolution) did not generate GL_INVALID_VALUE error"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
               ,0x140);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(_error_code + 0x1390))(0x9100,2,0x8058,local_1c + 1,local_1c + 1,1);
  iVar1 = (**(code **)(_error_code + 0x800))();
  if (iVar1 != 0x501) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,
               "Invalid glTexStorage2DMultisample() call ((max texture size+1, max texture size+1) resolution) did not generate GL_INVALID_VALUE error"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
               ,0x14c);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(_error_code + 0x1390))(0x9100,2,0x8058,0,0,1);
  iVar1 = (**(code **)(_error_code + 0x800))();
  if (iVar1 != 0x501) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,
               "Invalid glTexStorage2DMultisample() call with a 0x0 resolution did not generate GL_INVALID_VALUE error"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
               ,0x159);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(_error_code + 0x480))(1,&this->to_id);
  dVar2 = (**(code **)(_error_code + 0x800))();
  glu::checkError(dVar2,"glDeleteTextures() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x15f);
  (**(code **)(_error_code + 0x6f8))(1,&this->to_id);
  (**(code **)(_error_code + 0xb8))(0x9100,this->to_id);
  dVar2 = (**(code **)(_error_code + 0x800))();
  glu::checkError(dVar2,"Could not re-create 2D multisample texture object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x165);
  (**(code **)(_error_code + 0x1390))(0x9100,2,0x8058,0xffffffff,0,1);
  iVar1 = (**(code **)(_error_code + 0x800))();
  if (iVar1 != 0x501) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,
               "Invalid glTexStorage2DMultisample() call ((-1, 0) resolution) did not generate GL_INVALID_VALUE error"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
               ,0x171);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(_error_code + 0x1390))(0x9100,2,0x8058,0,0xffffffff,1);
  iVar1 = (**(code **)(_error_code + 0x800))();
  if (iVar1 != 0x501) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,
               "Invalid glTexStorage2DMultisample() call ((0, -1) resolution) did not generate GL_INVALID_VALUE error"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
               ,0x17d);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(_error_code + 0x1390))(0x9100,2,0x8058,0xffffffff,0xffffffff,1);
  iVar1 = (**(code **)(_error_code + 0x800))();
  if (iVar1 != 0x501) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,
               "Invalid glTexStorage2DMultisample() call ((-1, -1) resolution) did not generate GL_INVALID_VALUE error"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
               ,0x189);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureTexStorage2DInvalidAndBorderCaseTextureSizesTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* Retrieve GL_MAX_TEXTURE_SIZE pname value */
	glw::GLint gl_max_texture_size_value = 0;

	gl.getIntegerv(GL_MAX_TEXTURE_SIZE, &gl_max_texture_size_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not retrieve GL_MAX_TEXTURE_SIZE pname value");

	/* Try to set up a valid 2D multisample texture object of (max texture size, 1) resolution. */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_id);

	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 2 /* samples */, GL_RGBA8, gl_max_texture_size_value,
							   1 /* height */, GL_TRUE /* fixedsamplelocations */);

	GLU_EXPECT_NO_ERROR(gl.getError(),
						"Valid glTexStorage2DMultisample() call ((max texture size, 1) resolution) failed");

	/* Delete the texture object before we continue */
	gl.deleteTextures(1, &to_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures() failed");

	/* Create a new texture object and bind it to 2D multisample texture target. */
	gl.genTextures(1, &to_id);
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not re-create 2D multisample texture object");

	/* Try to set up another valid 2D multisample texture object of (1, max texture size) resolution. */
	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 2 /* samples */, GL_RGBA8, 1 /* width */,
							   gl_max_texture_size_value, GL_TRUE /* fixedsamplelocations */);

	GLU_EXPECT_NO_ERROR(gl.getError(),
						"Valid glTexStorage2DMultisample() call ((1, max texture size) resolution) failed");

	/* Delete the texture object before we continue */
	gl.deleteTextures(1, &to_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures() failed");

	/* Create a new texture object and bind it to 2D multisample texture target. */
	gl.genTextures(1, &to_id);
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not re-create 2D multisample texture object");

	/* Try to set up invalid 2D multisample texture objects. */
	glw::GLenum error_code = GL_NO_ERROR;

	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 2,			/* samples */
							   GL_RGBA8, gl_max_texture_size_value + 1, /* width */
							   1,										/* height */
							   GL_TRUE);								/* fixedsamplelocations */

	error_code = gl.getError();
	if (error_code != GL_INVALID_VALUE)
	{
		TCU_FAIL("Invalid glTexStorage2DMultisample() call ((max texture size+1, 1) resolution) did not generate "
				 "GL_INVALID_VALUE error");
	}

	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 2,  /* samples */
							   GL_RGBA8, 1,					  /* width */
							   gl_max_texture_size_value + 1, /* height */
							   GL_TRUE);					  /* fixedsamplelocations */

	error_code = gl.getError();
	if (error_code != GL_INVALID_VALUE)
	{
		TCU_FAIL("Invalid glTexStorage2DMultisample() call ((1, max texture size+1) resolution) did not generate "
				 "GL_INVALID_VALUE error");
	}

	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 2,			/* samples */
							   GL_RGBA8, gl_max_texture_size_value + 1, /* width */
							   gl_max_texture_size_value + 1,			/* height */
							   GL_TRUE);								/* fixedsamplelocations */

	error_code = gl.getError();
	if (error_code != GL_INVALID_VALUE)
	{
		TCU_FAIL("Invalid glTexStorage2DMultisample() call ((max texture size+1, max texture size+1) resolution) did "
				 "not generate GL_INVALID_VALUE error");
	}

	/* Try to set up a null resolution 2D multisample TO. */
	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 2, /* samples */
							   GL_RGBA8, 0,					 /* width */
							   0,							 /* height */
							   GL_TRUE);					 /* fixedsamplelocations */

	error_code = gl.getError();
	if (error_code != GL_INVALID_VALUE)
	{
		TCU_FAIL(
			"Invalid glTexStorage2DMultisample() call with a 0x0 resolution did not generate GL_INVALID_VALUE error");
	}

	/* Delete the texture object before we continue */
	gl.deleteTextures(1, &to_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures() failed");

	/* Create a new texture object and bind it to 2D multisample texture target. */
	gl.genTextures(1, &to_id);
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not re-create 2D multisample texture object");

	/* Try to set up an invalid texture object with at least one dimension size defined as a negative value */
	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 2 /* samples */, GL_RGBA8 /* sizedinternalformat */,
							   -1, /* width */
							   0,  /* height */
							   GL_TRUE /* fixedsamplelocations */);

	error_code = gl.getError();
	if (error_code != GL_INVALID_VALUE)
	{
		TCU_FAIL(
			"Invalid glTexStorage2DMultisample() call ((-1, 0) resolution) did not generate GL_INVALID_VALUE error");
	}

	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 2, /* samples */
							   GL_RGBA8, 0,					 /* width */
							   -1,							 /* height */
							   GL_TRUE);					 /* fixedsamplelocations */

	error_code = gl.getError();
	if (error_code != GL_INVALID_VALUE)
	{
		TCU_FAIL(
			"Invalid glTexStorage2DMultisample() call ((0, -1) resolution) did not generate GL_INVALID_VALUE error");
	}

	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 2, /* samples */
							   GL_RGBA8, -1,				 /* width */
							   -1,							 /* height */
							   GL_TRUE);					 /* fixedsamplelocations */

	error_code = gl.getError();
	if (error_code != GL_INVALID_VALUE)
	{
		TCU_FAIL(
			"Invalid glTexStorage2DMultisample() call ((-1, -1) resolution) did not generate GL_INVALID_VALUE error");
	}

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}